

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-wizard.c
# Opt level: O1

void do_cmd_wiz_rerate(command *cmd)

{
  uint32_t *puVar1;
  player_upkeep *ppVar2;
  uint32_t uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  
  iVar4 = (ushort)player->hitdie - 1;
  iVar6 = iVar4 * 0x96;
  iVar5 = iVar6 + 7;
  if (-1 < iVar6) {
    iVar5 = iVar6;
  }
  iVar4 = iVar4 * 0xfa;
  iVar6 = iVar4 + 7;
  if (-1 < iVar4) {
    iVar6 = iVar4;
  }
  player->player_hp[0] = (ushort)player->hitdie;
  lVar7 = 1;
  do {
    do {
      uVar3 = Rand_div((uint)player->hitdie);
      player->player_hp[lVar7] = (short)uVar3 + player->player_hp[lVar7 + -1] + 1;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x32);
    iVar4 = (int)player->player_hp[0x31];
    lVar7 = 1;
  } while ((iVar4 < (iVar5 >> 3) + 0x32) || ((iVar6 >> 3) + 0x32 < iVar4));
  lVar7 = (ulong)player->hitdie * 0x32;
  ppVar2 = player->upkeep;
  puVar1 = &ppVar2->update;
  *puVar1 = *puVar1 | 4;
  puVar1 = &ppVar2->redraw;
  *(byte *)puVar1 = (byte)*puVar1 | 0x40;
  msg("Current Life Rating is %d/100.",((long)iVar4 * 200) / lVar7 & 0xffffffff,
      ((long)iVar4 * 200) % lVar7);
  return;
}

Assistant:

void do_cmd_wiz_rerate(struct command *cmd)
{
	int min_value, max_value, percent;

	min_value = (PY_MAX_LEVEL * 3 * (player->hitdie - 1)) / 8;
	min_value += PY_MAX_LEVEL;

	max_value = (PY_MAX_LEVEL * 5 * (player->hitdie - 1)) / 8;
	max_value += PY_MAX_LEVEL;

	player->player_hp[0] = player->hitdie;

	/* Rerate */
	while (1) {
		int i;

		/* Collect values */
		for (i = 1; i < PY_MAX_LEVEL; i++) {
			player->player_hp[i] = randint1(player->hitdie);
			player->player_hp[i] += player->player_hp[i - 1];
		}

		/* Legal values */
		if (player->player_hp[PY_MAX_LEVEL - 1] >= min_value &&
			player->player_hp[PY_MAX_LEVEL - 1] <= max_value) break;
	}

	percent = (int)(((long)player->player_hp[PY_MAX_LEVEL - 1] * 200L) /
		(player->hitdie + ((PY_MAX_LEVEL - 1) * player->hitdie)));

	/* Update and redraw hitpoints */
	player->upkeep->update |= PU_HP;
	player->upkeep->redraw |= PR_HP;

	msg("Current Life Rating is %d/100.", percent);
}